

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_kv_fetch(unqlite *pDb,void *pKey,int nKeyLen,void *pBuf,unqlite_int64 *pBufLen)

{
  unqlite_kv_cursor *puVar1;
  unqlite_kv_methods *puVar2;
  int iVar3;
  SyBlob sBlob;
  
  iVar3 = -0x18;
  if ((pDb != (unqlite *)0x0) && (pDb->nMagic == 0xdb7c2712)) {
    puVar1 = (pDb->sDB).pCursor;
    puVar2 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
    if (nKeyLen < 0) {
      nKeyLen = SyStrlen((char *)pKey);
    }
    if (nKeyLen == 0) {
      unqliteGenError(pDb,"Empty key");
      iVar3 = -3;
    }
    else {
      iVar3 = (*puVar2->xSeek)(puVar1,pKey,nKeyLen,1);
      if (iVar3 == 0) {
        if (pBuf == (void *)0x0) {
          iVar3 = (*puVar2->xDataLength)(puVar1,pBufLen);
          return iVar3;
        }
        sBlob.mByte = (sxu32)*pBufLen;
        sBlob.nByte = 0;
        sBlob.pAllocator = (SyMemBackend *)0x0;
        sBlob.nFlags = 3;
        sBlob.pBlob = pBuf;
        iVar3 = (*puVar2->xData)(puVar1,unqliteDataConsumer,&sBlob);
        *pBufLen = (ulong)sBlob.nByte;
        SyBlobRelease(&sBlob);
      }
    }
  }
  return iVar3;
}

Assistant:

int unqlite_kv_fetch(unqlite *pDb,const void *pKey,int nKeyLen,void *pBuf,unqlite_int64 *pBufLen)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCur;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 pMethods = pEngine->pIo->pMethods;
	 pCur = pDb->sDB.pCursor;
	 if( nKeyLen < 0 ){
		 /* Assume a null terminated string and compute it's length */
		 nKeyLen = SyStrlen((const char *)pKey);
	 }
	 if( !nKeyLen ){
		  unqliteGenError(pDb,"Empty key");
		  rc = UNQLITE_EMPTY;
	 }else{
		  /* Seek to the record position */
		  rc = pMethods->xSeek(pCur,pKey,nKeyLen,UNQLITE_CURSOR_MATCH_EXACT);
	 }
	 if( rc == UNQLITE_OK ){
		 if( pBuf == 0 ){
			 /* Data length only */
			 rc = pMethods->xDataLength(pCur,pBufLen);
		 }else{
			 SyBlob sBlob;
			 /* Initialize the data consumer */
			 SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)*pBufLen);
			 /* Consume the data */
			 rc = pMethods->xData(pCur,unqliteDataConsumer,&sBlob);
			 /* Data length */
			 *pBufLen = (unqlite_int64)SyBlobLength(&sBlob);
			 /* Cleanup */
			 SyBlobRelease(&sBlob);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}